

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::createAffixMatchers
          (AffixMatcherWarehouse *this,AffixPatternProvider *patternInfo,
          MutableMatcherCollection *output,IgnorablesMatcher *ignorables,parse_flags_t parseFlags,
          UErrorCode *status)

{
  AffixPatternMatcher **ppAVar1;
  char16_t *pcVar2;
  bool bVar3;
  parse_flags_t parseFlags_00;
  MutableMatcherCollection *pMVar4;
  UErrorCode *status_00;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int8_t iVar8;
  AffixPatternMatcher *pAVar9;
  AffixPatternMatcher *pAVar10;
  AffixPatternMatcher *pAVar11;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  char16_t *pcVar13;
  ulong uVar14;
  int iVar15;
  AffixPatternMatcher *pAVar16;
  AffixMatcher *rhs;
  AffixPatternMatcher *pAVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  AffixPatternMatcher *pAVar21;
  AffixMatcherWarehouse *pAVar22;
  bool hasSuffix;
  bool hasPrefix;
  AffixMatcher temp;
  UnicodeString sb;
  bool local_12a;
  bool local_129;
  int local_128;
  uint local_124;
  AffixPatternMatcher *local_120;
  ulong local_118;
  AffixMatcherWarehouse *local_110;
  parse_flags_t local_108;
  uint local_104;
  undefined8 local_100;
  undefined1 local_f8 [16];
  undefined8 uStack_e8;
  AffixPatternMatcher local_e0;
  AffixPatternMatcher *local_90;
  AffixPatternProvider *local_88;
  MutableMatcherCollection *local_80;
  UErrorCode *local_78;
  UnicodeString local_70;
  
  local_110 = this;
  local_88 = patternInfo;
  bVar5 = isInteresting(patternInfo,ignorables,parseFlags,status);
  if (bVar5) {
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    local_e0.fPattern.fBuffer._12_4_ = (uint)parseFlags >> 10 & UNUM_SIGN_ALWAYS;
    local_90 = local_110->fAffixPatternMatchers;
    uVar12 = CONCAT71((int7)((ulong)extraout_RDX >> 8),2);
    local_e0.fPattern.fBuffer._16_8_ = &PTR__ArraySeriesMatcher_003d8ed8;
    local_118 = 0;
    iVar15 = 0;
    pAVar9 = (AffixPatternMatcher *)0x0;
    pAVar10 = (AffixPatternMatcher *)0x0;
    local_108 = parseFlags;
    local_80 = output;
    local_78 = status;
    do {
      status_00 = local_78;
      parseFlags_00 = local_108;
      cVar6 = (char)uVar12 + -1;
      local_129 = false;
      local_120 = pAVar9;
      local_100 = uVar12;
      local_e0.fPattern.fBuffer.ptr = (char16_t *)pAVar10;
      icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
                (local_88,true,cVar6,local_e0.fPattern.fBuffer._12_4_,OTHER,false,&local_70);
      AffixPatternMatcher::fromAffixPattern
                ((AffixPatternMatcher *)local_f8,&local_70,local_110->fTokenWarehouse,parseFlags_00,
                 &local_129,status_00);
      pAVar16 = local_90 + iVar15;
      if (local_90[iVar15].super_ArraySeriesMatcher.fMatchers.needToRelease != '\0') {
        uprv_free_63((pAVar16->super_ArraySeriesMatcher).fMatchers.ptr);
      }
      (pAVar16->super_ArraySeriesMatcher).fMatchers.capacity = (int)uStack_e8;
      (pAVar16->super_ArraySeriesMatcher).fMatchers.needToRelease = uStack_e8._4_1_;
      if ((AffixPatternMatcher *)local_f8._8_8_ == &local_e0) {
        pAVar9 = (AffixPatternMatcher *)(pAVar16->super_ArraySeriesMatcher).fMatchers.stackArray;
        memcpy(pAVar9,&local_e0,(long)(int)uStack_e8 << 3);
      }
      else {
        uStack_e8 = (AffixPatternMatcher *)CONCAT35(uStack_e8._5_3_,3);
        pAVar9 = (AffixPatternMatcher *)local_f8._8_8_;
        local_f8._8_8_ = &local_e0;
      }
      (pAVar16->super_ArraySeriesMatcher).fMatchers.ptr = (NumberParseMatcher **)pAVar9;
      (pAVar16->super_ArraySeriesMatcher).fMatchersLen =
           (int32_t)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[0];
      if ((pAVar16->fPattern).fBuffer.needToRelease != '\0') {
        uprv_free_63((pAVar16->fPattern).fBuffer.ptr);
      }
      (pAVar16->fPattern).fBuffer.capacity =
           (int)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2];
      (pAVar16->fPattern).fBuffer.needToRelease =
           local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._4_1_;
      pcVar2 = (char16_t *)((long)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray + 0x16);
      if (local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[1] == (NumberParseMatcher *)pcVar2)
      {
        pcVar13 = (pAVar16->fPattern).fBuffer.stackArray;
        memcpy(pcVar13,pcVar2,
               (long)(int)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2] * 2);
      }
      else {
        local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._0_4_ = 4;
        local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._4_1_ = '\0';
        pcVar13 = (char16_t *)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[1];
        local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[1] = (NumberParseMatcher *)pcVar2;
      }
      (pAVar16->fPattern).fBuffer.ptr = pcVar13;
      local_f8._0_8_ = &PTR__AffixPatternMatcher_003d7db0;
      MaybeStackArray<char16_t,_4>::~MaybeStackArray
                ((MaybeStackArray<char16_t,_4> *)
                 (local_e0.super_ArraySeriesMatcher.fMatchers.stackArray + 1));
      local_f8._0_2_ = local_e0.fPattern.fBuffer.stackArray[1];
      local_f8._2_2_ = local_e0.fPattern.fBuffer.stackArray[2];
      local_f8._4_2_ = local_e0.fPattern.fBuffer.stackArray[3];
      local_f8._6_2_ = local_e0.fPattern.fBuffer._22_2_;
      MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
                ((MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *)
                 (local_f8 + 8));
      NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_f8);
      local_104 = (uint)local_129;
      if (local_104 == 0) {
        pAVar16 = (AffixPatternMatcher *)0x0;
      }
      local_12a = false;
      icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
                (local_88,false,cVar6,local_e0.fPattern.fBuffer._12_4_,OTHER,false,&local_70);
      AffixPatternMatcher::fromAffixPattern
                ((AffixPatternMatcher *)local_f8,&local_70,local_110->fTokenWarehouse,local_108,
                 &local_12a,status_00);
      local_128 = iVar15 + local_104;
      pAVar21 = local_90 + local_128;
      if (local_90[local_128].super_ArraySeriesMatcher.fMatchers.needToRelease != '\0') {
        uprv_free_63((pAVar21->super_ArraySeriesMatcher).fMatchers.ptr);
      }
      (pAVar21->super_ArraySeriesMatcher).fMatchers.capacity = (int)uStack_e8;
      (pAVar21->super_ArraySeriesMatcher).fMatchers.needToRelease = uStack_e8._4_1_;
      if ((AffixPatternMatcher *)local_f8._8_8_ == &local_e0) {
        pAVar9 = (AffixPatternMatcher *)(pAVar21->super_ArraySeriesMatcher).fMatchers.stackArray;
        memcpy(pAVar9,&local_e0,(long)(int)uStack_e8 << 3);
      }
      else {
        uStack_e8 = (AffixPatternMatcher *)CONCAT35(uStack_e8._5_3_,3);
        pAVar9 = (AffixPatternMatcher *)local_f8._8_8_;
        local_f8._8_8_ = &local_e0;
      }
      (pAVar21->super_ArraySeriesMatcher).fMatchers.ptr = (NumberParseMatcher **)pAVar9;
      (pAVar21->super_ArraySeriesMatcher).fMatchersLen =
           (int32_t)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[0];
      if ((pAVar21->fPattern).fBuffer.needToRelease != '\0') {
        uprv_free_63((pAVar21->fPattern).fBuffer.ptr);
      }
      (pAVar21->fPattern).fBuffer.capacity =
           (int)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2];
      (pAVar21->fPattern).fBuffer.needToRelease =
           local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._4_1_;
      pcVar2 = (char16_t *)((long)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray + 0x16);
      if (local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[1] == (NumberParseMatcher *)pcVar2)
      {
        pcVar13 = (pAVar21->fPattern).fBuffer.stackArray;
        memcpy(pcVar13,pcVar2,
               (long)(int)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2] * 2);
      }
      else {
        local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._0_4_ = 4;
        local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._4_1_ = '\0';
        pcVar13 = (char16_t *)local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[1];
        local_e0.super_ArraySeriesMatcher.fMatchers.stackArray[1] = (NumberParseMatcher *)pcVar2;
      }
      (pAVar21->fPattern).fBuffer.ptr = pcVar13;
      local_f8._0_8_ = &PTR__AffixPatternMatcher_003d7db0;
      MaybeStackArray<char16_t,_4>::~MaybeStackArray
                ((MaybeStackArray<char16_t,_4> *)
                 (local_e0.super_ArraySeriesMatcher.fMatchers.stackArray + 1));
      local_f8._0_2_ = local_e0.fPattern.fBuffer.stackArray[1];
      local_f8._2_2_ = local_e0.fPattern.fBuffer.stackArray[2];
      local_f8._4_2_ = local_e0.fPattern.fBuffer.stackArray[3];
      local_f8._6_2_ = local_e0.fPattern.fBuffer._22_2_;
      MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
                ((MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *)
                 (local_f8 + 8));
      NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_f8);
      pcVar2 = local_e0.fPattern.fBuffer.ptr;
      pAVar9 = local_120;
      if (local_12a == false) {
        pAVar21 = (AffixPatternMatcher *)0x0;
      }
      local_124 = (uint)local_12a;
      pAVar11 = pAVar16;
      pAVar17 = pAVar21;
      if (((char)local_100 == '\x02') ||
         ((bVar7 = (byte)local_104 ^ 1, pAVar11 = pAVar9, pAVar17 = (AffixPatternMatcher *)pcVar2,
          (local_120 == (AffixPatternMatcher *)0x0 & bVar7) == 0 &&
          ((local_120 == (AffixPatternMatcher *)0x0 || bVar7 != 0 ||
           (bVar5 = CompactUnicodeString<4>::operator==(&pAVar16->fPattern,&local_120->fPattern),
           !bVar5)))))) {
LAB_002806f2:
        uVar12 = local_100;
        bVar5 = (char)local_108 < '\0';
        cVar6 = (char)local_100;
        local_f8._0_8_ = &PTR__NumberParseMatcher_003d8de8;
        uVar19 = (uint)(cVar6 == '\0');
        iVar15 = (int)local_118;
        uVar18 = iVar15 + 1;
        local_110->fAffixMatchers[iVar15].fFlags = uVar19;
        ppAVar1 = &local_110->fAffixMatchers[iVar15].fPrefix;
        *ppAVar1 = pAVar16;
        ppAVar1[1] = pAVar21;
        local_120 = pAVar11;
        local_f8._8_8_ = pAVar16;
        uStack_e8 = pAVar21;
        local_e0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
        super_NumberParseMatcher._vptr_NumberParseMatcher._0_4_ = uVar19;
        local_e0.fPattern.fBuffer.ptr = (char16_t *)pAVar17;
        NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_f8);
        pAVar10 = (AffixPatternMatcher *)local_e0.fPattern.fBuffer.ptr;
        if ((byte)(bVar5 & (byte)local_104 & (byte)local_124) == 1) {
          if (((cVar6 == '\x02') || (local_120 == (AffixPatternMatcher *)0x0)) ||
             (bVar5 = CompactUnicodeString<4>::operator==(&pAVar16->fPattern,&local_120->fPattern),
             !bVar5)) {
            local_f8._0_8_ = &PTR__NumberParseMatcher_003d8de8;
            uStack_e8 = (AffixPatternMatcher *)0x0;
            uVar20 = (int)local_118 + 2;
            local_110->fAffixMatchers[(int)uVar18].fFlags = uVar19;
            ppAVar1 = &local_110->fAffixMatchers[(int)uVar18].fPrefix;
            *ppAVar1 = pAVar16;
            ppAVar1[1] = (AffixPatternMatcher *)0x0;
            local_f8._8_8_ = pAVar16;
            local_e0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
            super_NumberParseMatcher._vptr_NumberParseMatcher._0_4_ = uVar19;
            NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_f8);
            uVar18 = uVar20;
            if ((char)local_100 != '\x02') goto LAB_0028082d;
LAB_0028084c:
            iVar15 = local_128;
            local_f8._0_8_ = &PTR__NumberParseMatcher_003d8de8;
            local_f8._8_8_ = (AffixPatternMatcher *)0x0;
            uVar18 = uVar20 + 1;
            local_110->fAffixMatchers[(int)uVar20].fFlags = uVar19;
            ppAVar1 = &local_110->fAffixMatchers[(int)uVar20].fPrefix;
            *ppAVar1 = (AffixPatternMatcher *)0x0;
            ppAVar1[1] = pAVar21;
            uStack_e8 = pAVar21;
            local_e0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
            super_NumberParseMatcher._vptr_NumberParseMatcher._0_4_ = uVar19;
            NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_f8);
          }
          else {
LAB_0028082d:
            uVar20 = uVar18;
            if ((pAVar10 == (AffixPatternMatcher *)0x0) ||
               (bVar5 = CompactUnicodeString<4>::operator==
                                  (&pAVar21->fPattern,
                                   (CompactUnicodeString<4> *)((long)pAVar10 + 0x38)),
               iVar15 = local_128, !bVar5)) goto LAB_0028084c;
          }
          local_118 = (ulong)uVar18;
          pAVar9 = local_120;
          uVar12 = local_100;
        }
        else {
          local_118 = (ulong)uVar18;
          pAVar9 = local_120;
          iVar15 = local_128;
        }
      }
      else {
        bVar7 = (byte)local_124 ^ 1;
        if (((AffixPatternMatcher *)pcVar2 == (AffixPatternMatcher *)0x0 & bVar7) == 0) {
          if (((AffixPatternMatcher *)pcVar2 == (AffixPatternMatcher *)0x0 || bVar7 != 0) ||
             (bVar5 = CompactUnicodeString<4>::operator==
                                (&pAVar21->fPattern,(CompactUnicodeString<4> *)((long)pcVar2 + 0x38)
                                ), pAVar9 = local_120, uVar12 = local_100,
             pAVar10 = (AffixPatternMatcher *)local_e0.fPattern.fBuffer.ptr, iVar15 = local_128,
             !bVar5)) goto LAB_002806f2;
        }
        else {
          pAVar10 = (AffixPatternMatcher *)0x0;
          uVar12 = local_100;
          iVar15 = local_128;
        }
      }
      iVar15 = iVar15 + local_124;
      cVar6 = (char)uVar12 + -1;
      uVar12 = CONCAT71((int7)((ulong)uVar12 >> 8),cVar6);
    } while (-1 < cVar6);
    uVar18 = (uint)local_118;
    if (1 < (int)uVar18) {
      uVar19 = 1;
      bVar5 = false;
      do {
        while( true ) {
          pAVar22 = local_110;
          rhs = local_110->fAffixMatchers + uVar19;
          iVar8 = AffixMatcher::compareTo(local_110->fAffixMatchers + (long)(int)uVar19 + -1,rhs);
          if (iVar8 < '\x01') break;
          local_f8._0_8_ = &PTR__NumberParseMatcher_003d8de8;
          local_e0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
          super_NumberParseMatcher._vptr_NumberParseMatcher._0_4_ =
               pAVar22->fAffixMatchers[(long)(int)uVar19 + -1].fFlags;
          local_f8._8_8_ = pAVar22->fAffixMatchers[(long)(int)uVar19 + -1].fPrefix;
          uStack_e8 = pAVar22->fAffixMatchers[(long)(int)uVar19 + -1].fSuffix;
          pAVar22->fAffixMatchers[(long)(int)uVar19 + -1].fFlags = rhs->fFlags;
          pAVar9 = rhs->fSuffix;
          pAVar22->fAffixMatchers[(long)(int)uVar19 + -1].fPrefix = rhs->fPrefix;
          pAVar22->fAffixMatchers[(long)(int)uVar19 + -1].fSuffix = pAVar9;
          rhs->fFlags = (uint)local_e0.super_ArraySeriesMatcher.super_SeriesMatcher.
                              super_CompositionMatcher.super_NumberParseMatcher.
                              _vptr_NumberParseMatcher;
          rhs->fPrefix = (AffixPatternMatcher *)local_f8._8_8_;
          rhs->fSuffix = uStack_e8;
          NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_f8);
          uVar19 = uVar19 + 1;
          bVar5 = (int)uVar19 < (int)local_118;
          if ((int)local_118 <= (int)uVar19) {
            uVar19 = 1;
          }
        }
        uVar20 = uVar19 + 1;
        uVar18 = (uint)local_118;
        uVar19 = uVar20;
        if ((int)uVar18 <= (int)uVar20) {
          uVar19 = 1;
        }
        bVar3 = (bool)((int)uVar20 < (int)uVar18 | bVar5);
        bVar5 = (bool)(bVar5 & (int)uVar20 < (int)uVar18);
      } while (bVar3);
    }
    pMVar4 = local_80;
    if (0 < (int)uVar18) {
      uVar14 = (ulong)uVar18;
      pAVar22 = local_110;
      do {
        (*pMVar4->_vptr_MutableMatcherCollection[2])(pMVar4,pAVar22);
        pAVar22 = (AffixMatcherWarehouse *)(pAVar22->fAffixMatchers + 1);
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    UnicodeString::~UnicodeString(&local_70);
  }
  return;
}

Assistant:

void AffixMatcherWarehouse::createAffixMatchers(const AffixPatternProvider& patternInfo,
                                                MutableMatcherCollection& output,
                                                const IgnorablesMatcher& ignorables,
                                                parse_flags_t parseFlags, UErrorCode& status) {
    if (!isInteresting(patternInfo, ignorables, parseFlags, status)) {
        return;
    }

    // The affixes have interesting characters, or we are in strict mode.
    // Use initial capacity of 6, the highest possible number of AffixMatchers.
    UnicodeString sb;
    bool includeUnpaired = 0 != (parseFlags & PARSE_FLAG_INCLUDE_UNPAIRED_AFFIXES);
    UNumberSignDisplay signDisplay = (0 != (parseFlags & PARSE_FLAG_PLUS_SIGN_ALLOWED)) ? UNUM_SIGN_ALWAYS
                                                                                        : UNUM_SIGN_AUTO;

    int32_t numAffixMatchers = 0;
    int32_t numAffixPatternMatchers = 0;

    AffixPatternMatcher* posPrefix = nullptr;
    AffixPatternMatcher* posSuffix = nullptr;

    // Pre-process the affix strings to resolve LDML rules like sign display.
    for (int8_t signum = 1; signum >= -1; signum--) {
        // Generate Prefix
        bool hasPrefix = false;
        PatternStringUtils::patternInfoToStringBuilder(
                patternInfo, true, signum, signDisplay, StandardPlural::OTHER, false, sb);
        fAffixPatternMatchers[numAffixPatternMatchers] = AffixPatternMatcher::fromAffixPattern(
                sb, *fTokenWarehouse, parseFlags, &hasPrefix, status);
        AffixPatternMatcher* prefix = hasPrefix ? &fAffixPatternMatchers[numAffixPatternMatchers++]
                                                : nullptr;

        // Generate Suffix
        bool hasSuffix = false;
        PatternStringUtils::patternInfoToStringBuilder(
                patternInfo, false, signum, signDisplay, StandardPlural::OTHER, false, sb);
        fAffixPatternMatchers[numAffixPatternMatchers] = AffixPatternMatcher::fromAffixPattern(
                sb, *fTokenWarehouse, parseFlags, &hasSuffix, status);
        AffixPatternMatcher* suffix = hasSuffix ? &fAffixPatternMatchers[numAffixPatternMatchers++]
                                                : nullptr;

        if (signum == 1) {
            posPrefix = prefix;
            posSuffix = suffix;
        } else if (equals(prefix, posPrefix) && equals(suffix, posSuffix)) {
            // Skip adding these matchers (we already have equivalents)
            continue;
        }

        // Flags for setting in the ParsedNumber; the token matchers may add more.
        int flags = (signum == -1) ? FLAG_NEGATIVE : 0;

        // Note: it is indeed possible for posPrefix and posSuffix to both be null.
        // We still need to add that matcher for strict mode to work.
        fAffixMatchers[numAffixMatchers++] = {prefix, suffix, flags};
        if (includeUnpaired && prefix != nullptr && suffix != nullptr) {
            // The following if statements are designed to prevent adding two identical matchers.
            if (signum == 1 || !equals(prefix, posPrefix)) {
                fAffixMatchers[numAffixMatchers++] = {prefix, nullptr, flags};
            }
            if (signum == 1 || !equals(suffix, posSuffix)) {
                fAffixMatchers[numAffixMatchers++] = {nullptr, suffix, flags};
            }
        }
    }

    // Put the AffixMatchers in order, and then add them to the output.
    // Since there are at most 9 elements, do a simple-to-implement bubble sort.
    bool madeChanges;
    do {
        madeChanges = false;
        for (int32_t i = 1; i < numAffixMatchers; i++) {
            if (fAffixMatchers[i - 1].compareTo(fAffixMatchers[i]) > 0) {
                madeChanges = true;
                AffixMatcher temp = std::move(fAffixMatchers[i - 1]);
                fAffixMatchers[i - 1] = std::move(fAffixMatchers[i]);
                fAffixMatchers[i] = std::move(temp);
            }
        }
    } while (madeChanges);

    for (int32_t i = 0; i < numAffixMatchers; i++) {
        // Enable the following line to debug affixes
        //std::cout << "Adding affix matcher: " << CStr(fAffixMatchers[i].toString())() << std::endl;
        output.addMatcher(fAffixMatchers[i]);
    }
}